

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadMultiChannelEXRFromFile(EXRImage *exrImage,char *filename,char **err)

{
  FILE *__stream;
  reference pvVar1;
  pointer puVar2;
  size_t ret;
  allocator<unsigned_char> local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  char **err_local;
  char *filename_local;
  EXRImage *exrImage_local;
  
  if (exrImage == (EXRImage *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    exrImage_local._4_4_ = -1;
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      if (err != (char **)0x0) {
        *err = "Cannot read file.";
      }
      exrImage_local._4_4_ = -1;
    }
    else {
      fseek(__stream,0,2);
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)ftell(__stream);
      fseek(__stream,0,0);
      puVar2 = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      std::allocator<unsigned_char>::allocator(&local_51);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(size_type)puVar2
                 ,&local_51);
      std::allocator<unsigned_char>::~allocator(&local_51);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      puVar2 = (pointer)fread(pvVar1,1,(size_t)buf.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              __stream);
      if (puVar2 != buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("ret == filesize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x234f,
                      "int LoadMultiChannelEXRFromFile(EXRImage *, const char *, const char **)");
      }
      fclose(__stream);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      exrImage_local._4_4_ = LoadMultiChannelEXRFromMemory(exrImage,pvVar1,err);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    }
  }
  return exrImage_local._4_4_;
}

Assistant:

int LoadMultiChannelEXRFromFile(EXRImage *exrImage, const char *filename,
                                const char **err) {
  if (exrImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadMultiChannelEXRFromMemory(exrImage, &buf.at(0), err);
}